

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCenterLineProfileDef::~IfcCenterLineProfileDef
          (IfcCenterLineProfileDef *this)

{
  ~IfcCenterLineProfileDef
            ((IfcCenterLineProfileDef *)
             &this[-1].super_IfcArbitraryOpenProfileDef.super_IfcProfileDef.ProfileName);
  return;
}

Assistant:

IfcCenterLineProfileDef() : Object("IfcCenterLineProfileDef") {}